

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O2

_Bool set_contains(TSCharacterRange *ranges,uint32_t len,int32_t lookahead)

{
  uint uVar1;
  uint uVar2;
  
  uVar2 = 0;
  while( true ) {
    if (len < 2) {
      if (lookahead < ranges[uVar2].start) {
        return false;
      }
      return lookahead <= ranges[uVar2].end;
    }
    uVar1 = uVar2 + (len >> 1);
    if (lookahead <= ranges[uVar1].end && ranges[uVar1].start <= lookahead) break;
    if (lookahead <= ranges[uVar1].end) {
      uVar1 = uVar2;
    }
    uVar2 = uVar1;
    len = len - (len >> 1);
  }
  return true;
}

Assistant:

static inline bool set_contains(TSCharacterRange *ranges, uint32_t len, int32_t lookahead) {
  uint32_t index = 0;
  uint32_t size = len - index;
  while (size > 1) {
    uint32_t half_size = size / 2;
    uint32_t mid_index = index + half_size;
    TSCharacterRange *range = &ranges[mid_index];
    if (lookahead >= range->start && lookahead <= range->end) {
      return true;
    } else if (lookahead > range->end) {
      index = mid_index;
    }
    size -= half_size;
  }
  TSCharacterRange *range = &ranges[index];
  return (lookahead >= range->start && lookahead <= range->end);
}